

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint256_tests.cpp
# Opt level: O2

void uint256_tests::TestFromHex<transaction_identifier<true>>(void)

{
  char __rhs;
  long lVar1;
  long lVar2;
  _Alloc_hider _Var3;
  long lVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator pvVar6;
  iterator in_R9;
  string *psVar7;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  string_view hex;
  const_string file;
  const_string file_00;
  string_view str;
  const_string file_01;
  const_string file_02;
  string_view hex_00;
  const_string file_03;
  string_view hex_01;
  const_string file_04;
  string_view hex_02;
  const_string file_05;
  string_view hex_03;
  const_string file_06;
  string_view hex_04;
  const_string file_07;
  string_view hex_05;
  const_string file_08;
  string_view hex_06;
  const_string file_09;
  string_view hex_07;
  string_view str_00;
  const_string file_10;
  string_view hex_08;
  const_string file_11;
  string_view hex_09;
  check_type cVar9;
  string *psVar8;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  assertion_result local_2a8;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  undefined1 local_120 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_110;
  undefined1 local_100 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_f0;
  string invalid_prefix;
  string invalid_chars;
  optional<transaction_identifier<true>_> valid_result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> valid_input;
  string valid_64char_input;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&valid_64char_input,
             "0123456789abcdef0123456789ABCDEF0123456789abcdef0123456789ABCDEF",
             (allocator<char> *)&valid_result);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&valid_input,&valid_64char_input,0,0x40);
  hex._M_str = valid_input._M_dataplus._M_p;
  hex._M_len = valid_input._M_string_length;
  transaction_identifier<true>::FromHex(&valid_result,hex);
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x105;
  file.m_begin = (iterator)&local_130;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_140,msg);
  invalid_prefix._M_dataplus._M_p._0_1_ =
       valid_result.super__Optional_base<transaction_identifier<true>,_true,_true>._M_payload.
       super__Optional_payload_base<transaction_identifier<true>_>._M_engaged;
  invalid_prefix._M_string_length = 0;
  invalid_prefix.field_2._M_allocated_capacity = 0;
  invalid_chars.field_2._8_8_ = local_100;
  local_100._0_8_ = "valid_result";
  local_100._8_8_ = "";
  invalid_chars._M_string_length._0_1_ = 0;
  invalid_chars._M_dataplus._M_p = "<W\x1b";
  invalid_chars.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_150 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_148 = "";
  pvVar5 = (iterator)0x2;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&invalid_prefix,(lazy_ostream *)&invalid_chars,2,0,WARN,_cVar9,
             (size_t)&local_150,0x105);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&invalid_prefix.field_2._M_allocated_capacity);
  local_160 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  file_00.m_end = (iterator)0x106;
  file_00.m_begin = (iterator)&local_160;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_170,
             msg_00);
  invalid_chars._M_string_length._0_1_ = 0;
  invalid_chars._M_dataplus._M_p = "<W\x1b";
  invalid_chars.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  invalid_chars.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_178 = "";
  base_blob<256u>::ToString_abi_cxx11_(&invalid_prefix,(base_blob<256u> *)&valid_result);
  psVar8 = (string *)local_100;
  str._M_str = valid_input._M_dataplus._M_p;
  str._M_len = valid_input._M_string_length;
  ToLower_abi_cxx11_(psVar8,str);
  pvVar5 = (iterator)0x2;
  psVar7 = &invalid_prefix;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&invalid_chars,&local_180,0x106,1,2,psVar7,"valid_result->ToString()",psVar8,
             "ToLower(valid_input)");
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string((string *)&invalid_prefix);
  local_190 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)psVar7;
  msg_01.m_begin = pvVar5;
  file_01.m_end = (iterator)0x10a;
  file_01.m_begin = (iterator)&local_190;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1a0,
             msg_01);
  transaction_identifier<true>::FromHex(&valid_result,(string_view)(ZEXT816(0xc694e1) << 0x40));
  invalid_prefix._M_dataplus._M_p =
       (pointer)(CONCAT71(invalid_prefix._M_dataplus._M_p._1_7_,
                          valid_result.
                          super__Optional_base<transaction_identifier<true>,_true,_true>._M_payload.
                          super__Optional_payload_base<transaction_identifier<true>_>._M_engaged) ^
                1);
  invalid_prefix._M_string_length = 0;
  invalid_prefix.field_2._M_allocated_capacity = 0;
  local_100._0_8_ = "!T::FromHex(\"\")";
  local_100._8_8_ = "";
  invalid_chars._M_string_length._0_1_ = 0;
  invalid_chars._M_dataplus._M_p = "<W\x1b";
  invalid_chars.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_1a8 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  invalid_chars.field_2._8_8_ = (string *)local_100;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&invalid_prefix,(lazy_ostream *)&invalid_chars,1,0,WARN,
             (check_type)psVar8,(size_t)&local_1b0,0x10a);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&invalid_prefix.field_2._M_allocated_capacity);
  local_1c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar6;
  msg_02.m_begin = pvVar5;
  file_02.m_end = (iterator)0x10b;
  file_02.m_begin = (iterator)&local_1c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1d0,
             msg_02);
  hex_00._M_str = "0";
  hex_00._M_len = 1;
  transaction_identifier<true>::FromHex(&valid_result,hex_00);
  invalid_prefix._M_dataplus._M_p =
       (pointer)(CONCAT71(invalid_prefix._M_dataplus._M_p._1_7_,
                          valid_result.
                          super__Optional_base<transaction_identifier<true>,_true,_true>._M_payload.
                          super__Optional_payload_base<transaction_identifier<true>_>._M_engaged) ^
                1);
  invalid_prefix._M_string_length = 0;
  invalid_prefix.field_2._M_allocated_capacity = 0;
  local_100._0_8_ = "!T::FromHex(\"0\")";
  local_100._8_8_ = "";
  invalid_chars._M_string_length._0_1_ = 0;
  invalid_chars._M_dataplus._M_p = "<W\x1b";
  invalid_chars.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_1d8 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  invalid_chars.field_2._8_8_ = (string *)local_100;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&invalid_prefix,(lazy_ostream *)&invalid_chars,1,0,WARN,
             (check_type)psVar8,(size_t)&local_1e0,0x10b);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&invalid_prefix.field_2._M_allocated_capacity);
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar6;
  msg_03.m_begin = pvVar5;
  file_03.m_end = (iterator)0x10c;
  file_03.m_begin = (iterator)&local_1f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_200,
             msg_03);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&invalid_chars,&valid_input,0,0x20);
  hex_01._M_len._1_7_ = invalid_chars._M_string_length._1_7_;
  hex_01._M_len._0_1_ = (undefined1)invalid_chars._M_string_length;
  hex_01._M_str = invalid_chars._M_dataplus._M_p;
  transaction_identifier<true>::FromHex(&valid_result,hex_01);
  local_100._0_8_ =
       CONCAT71(local_100._1_7_,
                valid_result.super__Optional_base<transaction_identifier<true>,_true,_true>.
                _M_payload.super__Optional_payload_base<transaction_identifier<true>_>._M_engaged) ^
       1;
  local_100._8_8_ = (element_type *)0x0;
  aStack_f0._M_allocated_capacity = 0;
  local_120._0_8_ = "!T::FromHex(valid_input.substr(0, num_chars / 2))";
  local_120._8_8_ = "";
  invalid_prefix._M_string_length = invalid_prefix._M_string_length & 0xffffffffffffff00;
  invalid_prefix._M_dataplus._M_p = "<W\x1b";
  invalid_prefix.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_208 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  invalid_prefix.field_2._8_8_ = local_120;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_100,(lazy_ostream *)&invalid_prefix,1,0,WARN,
             (check_type)psVar8,(size_t)&local_210,0x10c);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_f0._M_allocated_capacity);
  std::__cxx11::string::~string((string *)&invalid_chars);
  local_220 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar6;
  msg_04.m_begin = pvVar5;
  file_04.m_end = (iterator)0x10d;
  file_04.m_begin = (iterator)&local_220;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_230,
             msg_04);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&invalid_chars,&valid_input,0,0x3f);
  hex_02._M_len._1_7_ = invalid_chars._M_string_length._1_7_;
  hex_02._M_len._0_1_ = (undefined1)invalid_chars._M_string_length;
  hex_02._M_str = invalid_chars._M_dataplus._M_p;
  transaction_identifier<true>::FromHex(&valid_result,hex_02);
  local_100._0_8_ =
       CONCAT71(local_100._1_7_,
                valid_result.super__Optional_base<transaction_identifier<true>,_true,_true>.
                _M_payload.super__Optional_payload_base<transaction_identifier<true>_>._M_engaged) ^
       1;
  local_100._8_8_ = (element_type *)0x0;
  aStack_f0._M_allocated_capacity = 0;
  local_120._0_8_ = "!T::FromHex(valid_input.substr(0, num_chars - 1))";
  local_120._8_8_ = "";
  invalid_prefix._M_string_length = invalid_prefix._M_string_length & 0xffffffffffffff00;
  invalid_prefix._M_dataplus._M_p = "<W\x1b";
  invalid_prefix.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_238 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  invalid_prefix.field_2._8_8_ = local_120;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_100,(lazy_ostream *)&invalid_prefix,1,0,WARN,
             (check_type)psVar8,(size_t)&local_240,0x10d);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_f0._M_allocated_capacity);
  std::__cxx11::string::~string((string *)&invalid_chars);
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar6;
  msg_05.m_begin = pvVar5;
  file_05.m_end = (iterator)0x10e;
  file_05.m_begin = (iterator)&local_250;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_260,
             msg_05);
  std::operator+(&invalid_chars,&valid_input,"0");
  hex_03._M_len._1_7_ = invalid_chars._M_string_length._1_7_;
  hex_03._M_len._0_1_ = (undefined1)invalid_chars._M_string_length;
  hex_03._M_str = invalid_chars._M_dataplus._M_p;
  transaction_identifier<true>::FromHex(&valid_result,hex_03);
  local_100._0_8_ =
       CONCAT71(local_100._1_7_,
                valid_result.super__Optional_base<transaction_identifier<true>,_true,_true>.
                _M_payload.super__Optional_payload_base<transaction_identifier<true>_>._M_engaged) ^
       1;
  local_100._8_8_ = (element_type *)0x0;
  aStack_f0._M_allocated_capacity = 0;
  local_120._0_8_ = "!T::FromHex(valid_input + \"0\")";
  local_120._8_8_ = "";
  invalid_prefix._M_string_length = invalid_prefix._M_string_length & 0xffffffffffffff00;
  invalid_prefix._M_dataplus._M_p = "<W\x1b";
  invalid_prefix.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_268 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  invalid_prefix.field_2._8_8_ = local_120;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_100,(lazy_ostream *)&invalid_prefix,1,0,WARN,
             (check_type)psVar8,(size_t)&local_270,0x10e);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_f0._M_allocated_capacity);
  std::__cxx11::string::~string((string *)&invalid_chars);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&invalid_chars,
             " !\"#$%&\'()*+,-./:;<=>?@GHIJKLMNOPQRSTUVWXYZ[\\]^_`ghijklmnopqrstuvwxyz{|}~",
             (allocator<char> *)&valid_result);
  _Var3 = invalid_chars._M_dataplus;
  lVar2 = CONCAT71(invalid_chars._M_string_length._1_7_,(undefined1)invalid_chars._M_string_length);
  for (lVar4 = 0; lVar2 != lVar4; lVar4 = lVar4 + 1) {
    __rhs = _Var3._M_p[lVar4];
    local_280 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_278 = "";
    local_290 = &boost::unit_test::basic_cstring<char_const>::null;
    local_288 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_06.m_end = pvVar6;
    msg_06.m_begin = pvVar5;
    file_06.m_end = (iterator)0x114;
    file_06.m_begin = (iterator)&local_280;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_290,
               msg_06);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
               &valid_input,0,0x3f);
    std::operator+(&invalid_prefix,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                   __rhs);
    hex_04._M_str = invalid_prefix._M_dataplus._M_p;
    hex_04._M_len = invalid_prefix._M_string_length;
    transaction_identifier<true>::FromHex(&valid_result,hex_04);
    local_2a8._0_8_ =
         CONCAT71(local_2a8._1_7_,
                  valid_result.super__Optional_base<transaction_identifier<true>,_true,_true>.
                  _M_payload.super__Optional_payload_base<transaction_identifier<true>_>._M_engaged)
         ^ 1;
    local_2a8.m_message.px = (element_type *)0x0;
    local_2a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_2b8 = "!T::FromHex(valid_input.substr(0, num_chars - 1) + c)";
    local_2b0 = "";
    local_120._8_8_ = local_120._8_8_ & 0xffffffffffffff00;
    local_120._0_8_ = &PTR__lazy_ostream_0113a070;
    aStack_110._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    aStack_110._8_8_ = &local_2b8;
    local_2c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_2c0 = "";
    pvVar5 = &DAT_00000001;
    pvVar6 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_2a8,(lazy_ostream *)local_120,1,0,WARN,(check_type)psVar8,(size_t)&local_2c8,
               0x114);
    boost::detail::shared_count::~shared_count(&local_2a8.m_message.pn);
    std::__cxx11::string::~string((string *)&invalid_prefix);
    std::__cxx11::string::~string((string *)local_100);
  }
  std::operator+(&invalid_prefix,"0x",&valid_input);
  local_2d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar6;
  msg_07.m_begin = pvVar5;
  file_07.m_end = (iterator)0x118;
  file_07.m_begin = (iterator)&local_2d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2e8,
             msg_07);
  hex_05._M_str = invalid_prefix._M_dataplus._M_p;
  hex_05._M_len = 0x40;
  transaction_identifier<true>::FromHex(&valid_result,hex_05);
  local_120._0_8_ =
       CONCAT71(local_120._1_7_,
                valid_result.super__Optional_base<transaction_identifier<true>,_true,_true>.
                _M_payload.super__Optional_payload_base<transaction_identifier<true>_>._M_engaged) ^
       1;
  local_120._8_8_ = (element_type *)0x0;
  aStack_110._M_allocated_capacity = 0;
  local_2a8._0_8_ = "!T::FromHex(std::string_view(invalid_prefix.data(), num_chars))";
  local_2a8.m_message.px = (element_type *)0xc68234;
  local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
  local_100._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_f0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_f0._8_8_ = &local_2a8;
  local_2f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_2f0 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_120,(lazy_ostream *)local_100,1,0,WARN,(check_type)psVar8,
             (size_t)&local_2f8,0x118);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_110._M_allocated_capacity);
  local_308 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_300 = "";
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar6;
  msg_08.m_begin = pvVar5;
  file_08.m_end = (iterator)0x119;
  file_08.m_begin = (iterator)&local_308;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_318,
             msg_08);
  hex_06._M_str = invalid_prefix._M_dataplus._M_p;
  hex_06._M_len = invalid_prefix._M_string_length;
  transaction_identifier<true>::FromHex(&valid_result,hex_06);
  local_120._0_8_ =
       CONCAT71(local_120._1_7_,
                valid_result.super__Optional_base<transaction_identifier<true>,_true,_true>.
                _M_payload.super__Optional_payload_base<transaction_identifier<true>_>._M_engaged) ^
       1;
  local_120._8_8_ = (element_type *)0x0;
  aStack_110._M_allocated_capacity = 0;
  local_2a8._0_8_ = "!T::FromHex(invalid_prefix)";
  local_2a8.m_message.px = (element_type *)0xc68250;
  local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
  local_100._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_f0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_f0._8_8_ = &local_2a8;
  local_328 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_320 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_120,(lazy_ostream *)local_100,1,0,WARN,(check_type)psVar8,
             (size_t)&local_328,0x119);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_110._M_allocated_capacity);
  std::__cxx11::string::~string((string *)&invalid_prefix);
  std::__cxx11::string::~string((string *)&invalid_chars);
  std::operator+(&invalid_chars,&valid_64char_input,"0123");
  local_338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_330 = "";
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = pvVar6;
  msg_09.m_begin = pvVar5;
  file_09.m_end = (iterator)0x11e;
  file_09.m_begin = (iterator)&local_338;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_348,
             msg_09);
  invalid_prefix._M_string_length = invalid_prefix._M_string_length & 0xffffffffffffff00;
  invalid_prefix._M_dataplus._M_p = "<W\x1b";
  invalid_prefix.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  invalid_prefix.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_350 = "";
  hex_07._M_str = invalid_chars._M_dataplus._M_p;
  hex_07._M_len = 0x40;
  transaction_identifier<true>::FromHex(&valid_result,hex_07);
  if (valid_result.super__Optional_base<transaction_identifier<true>,_true,_true>._M_payload.
      super__Optional_payload_base<transaction_identifier<true>_>._M_engaged == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    base_blob<256u>::ToString_abi_cxx11_((string *)local_100,(base_blob<256u> *)&valid_result);
    psVar8 = (string *)local_120;
    str_00._M_str = valid_input._M_dataplus._M_p;
    str_00._M_len = valid_input._M_string_length;
    ToLower_abi_cxx11_(psVar8,str_00);
    pvVar6 = (iterator)0x2;
    pvVar5 = local_100;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (&invalid_prefix,&local_358,0x11e,1,2,pvVar5,
               "T::FromHex(std::string_view(chars_68.data(), num_chars)).value().ToString()",psVar8,
               "ToLower(valid_input)");
    std::__cxx11::string::~string((string *)local_120);
    std::__cxx11::string::~string((string *)local_100);
    local_368 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_360 = "";
    local_378 = &boost::unit_test::basic_cstring<char_const>::null;
    local_370 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_10.m_end = pvVar5;
    msg_10.m_begin = pvVar6;
    file_10.m_end = (iterator)0x11f;
    file_10.m_begin = (iterator)&local_368;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_378,
               msg_10);
    hex_08._M_str = invalid_chars._M_dataplus._M_p;
    hex_08._M_len = 0x3f;
    transaction_identifier<true>::FromHex(&valid_result,hex_08);
    local_100._0_8_ =
         CONCAT71(local_100._1_7_,
                  valid_result.super__Optional_base<transaction_identifier<true>,_true,_true>.
                  _M_payload.super__Optional_payload_base<transaction_identifier<true>_>._M_engaged)
         ^ 1;
    local_100._8_8_ = (element_type *)0x0;
    aStack_f0._M_allocated_capacity = 0;
    local_120._0_8_ = "!T::FromHex(std::string_view(chars_68.data(), num_chars - 1))";
    local_120._8_8_ = "";
    invalid_prefix._M_string_length = invalid_prefix._M_string_length & 0xffffffffffffff00;
    invalid_prefix._M_dataplus._M_p = "<W\x1b";
    invalid_prefix.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_388 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_380 = "";
    pvVar5 = &DAT_00000001;
    pvVar6 = (iterator)0x0;
    invalid_prefix.field_2._8_8_ = (string *)local_120;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_100,(lazy_ostream *)&invalid_prefix,1,0,WARN,
               (check_type)psVar8,(size_t)&local_388,0x11f);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_f0._M_allocated_capacity);
    local_398 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_390 = "";
    local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_11.m_end = pvVar6;
    msg_11.m_begin = pvVar5;
    file_11.m_end = (iterator)0x120;
    file_11.m_begin = (iterator)&local_398;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_3a8,
               msg_11);
    hex_09._M_str = invalid_chars._M_dataplus._M_p;
    hex_09._M_len = 0x41;
    transaction_identifier<true>::FromHex(&valid_result,hex_09);
    local_100._0_8_ =
         CONCAT71(local_100._1_7_,
                  valid_result.super__Optional_base<transaction_identifier<true>,_true,_true>.
                  _M_payload.super__Optional_payload_base<transaction_identifier<true>_>._M_engaged)
         ^ 1;
    local_100._8_8_ = (element_type *)0x0;
    aStack_f0._M_allocated_capacity = 0;
    local_120._0_8_ = "!T::FromHex(std::string_view(chars_68.data(), num_chars + 1))";
    local_120._8_8_ = "";
    invalid_prefix._M_string_length = invalid_prefix._M_string_length & 0xffffffffffffff00;
    invalid_prefix._M_dataplus._M_p = "<W\x1b";
    invalid_prefix.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_3b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_3b0 = "";
    invalid_prefix.field_2._8_8_ = (string *)local_120;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_100,(lazy_ostream *)&invalid_prefix,1,0,WARN,
               (check_type)psVar8,(size_t)&local_3b8,0x120);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_f0._M_allocated_capacity);
    std::__cxx11::string::~string((string *)&invalid_chars);
    std::__cxx11::string::~string((string *)&valid_input);
    std::__cxx11::string::~string((string *)&valid_64char_input);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void TestFromHex()
{
    constexpr unsigned int num_chars{T::size() * 2};
    static_assert(num_chars <= 64); // this test needs to be modified to allow for more than 64 hex chars
    const std::string valid_64char_input{"0123456789abcdef0123456789ABCDEF0123456789abcdef0123456789ABCDEF"};
    const auto valid_input{valid_64char_input.substr(0, num_chars)};
    {
        // check that lower and upper case hex characters are accepted
        auto valid_result{T::FromHex(valid_input)};
        BOOST_REQUIRE(valid_result);
        BOOST_CHECK_EQUAL(valid_result->ToString(), ToLower(valid_input));
    }
    {
        // check that only strings of size num_chars are accepted
        BOOST_CHECK(!T::FromHex(""));
        BOOST_CHECK(!T::FromHex("0"));
        BOOST_CHECK(!T::FromHex(valid_input.substr(0, num_chars / 2)));
        BOOST_CHECK(!T::FromHex(valid_input.substr(0, num_chars - 1)));
        BOOST_CHECK(!T::FromHex(valid_input + "0"));
    }
    {
        // check that non-hex characters are not accepted
        std::string invalid_chars{R"( !"#$%&'()*+,-./:;<=>?@GHIJKLMNOPQRSTUVWXYZ[\]^_`ghijklmnopqrstuvwxyz{|}~)"};
        for (auto c : invalid_chars) {
            BOOST_CHECK(!T::FromHex(valid_input.substr(0, num_chars - 1) + c));
        }
        // 0x prefixes are invalid
        std::string invalid_prefix{"0x" + valid_input};
        BOOST_CHECK(!T::FromHex(std::string_view(invalid_prefix.data(), num_chars)));
        BOOST_CHECK(!T::FromHex(invalid_prefix));
    }
    {
        // check that string_view length is respected
        std::string chars_68{valid_64char_input + "0123"};
        BOOST_CHECK_EQUAL(T::FromHex(std::string_view(chars_68.data(), num_chars)).value().ToString(), ToLower(valid_input));
        BOOST_CHECK(!T::FromHex(std::string_view(chars_68.data(), num_chars - 1))); // too short
        BOOST_CHECK(!T::FromHex(std::string_view(chars_68.data(), num_chars + 1))); // too long
    }
}